

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HArray.hpp
# Opt level: O3

Value<char> * __thiscall
Qentem::HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
          (HArray<Qentem::String<char>,_Qentem::Value<char>_> *this,Char_T *key,SizeT length)

{
  SizeT *pSVar1;
  long lVar2;
  int iVar3;
  SizeT SVar4;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *pHVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  SizeT SVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  Value<char> *pVVar15;
  SizeT *index;
  SizeT *local_48;
  String<char> local_40;
  
  SVar11 = (this->
           super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ).index_;
  if (SVar11 == (this->
                super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                ).capacity_) {
    HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
    resize(&this->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ,(SVar11 + (SVar11 == 0)) * 2);
  }
  if (length == 0) {
    SVar11 = 0x8000000b;
  }
  else {
    uVar10 = 0xb;
    iVar3 = 0;
    uVar9 = 0;
    uVar7 = (ulong)length;
    iVar12 = 0x21;
    do {
      pcVar6 = key + uVar9;
      iVar14 = iVar3 + iVar12;
      uVar8 = (uint)uVar9;
      iVar3 = iVar3 + 2;
      uVar13 = (uint)uVar7;
      uVar9 = uVar9 + 1;
      lVar2 = uVar7 - 1;
      uVar7 = uVar7 - 1;
      uVar10 = (int)key[lVar2] + (uVar13 ^ uVar8) * ((int)*pcVar6 * iVar12 * uVar8 + uVar10);
      iVar12 = iVar14;
    } while (uVar9 < uVar7);
    SVar11 = uVar10 | 0x80000000;
  }
  pHVar5 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ::find(&this->
                   super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                  ,&local_48,key,length,SVar11);
  if (pHVar5 == (HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)0x0) {
    local_40.storage_ = (char *)0x0;
    local_40.length_ = 0;
    pcVar6 = String<char>::allocate(&local_40,length + 1);
    Memory::Copy<unsigned_int>(pcVar6,key,length);
    pcVar6[length] = '\0';
    uVar10 = (this->
             super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             ).capacity_;
    uVar8 = (this->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            ).index_;
    pSVar1 = (this->
             super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             ).hashTable_;
    SVar4 = uVar8 + 1;
    (this->
    super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
    ).index_ = SVar4;
    *local_48 = SVar4;
    pVVar15 = (Value<char> *)(pSVar1 + (ulong)uVar10 + (ulong)uVar8 * 0xc + 6);
    ((HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)(pVVar15 + -1))->Hash = SVar11;
    ((HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)(pVVar15 + -1))->Next = 0;
    (((HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)(pVVar15 + -1))->Key).storage_ =
         local_40.storage_;
    (((HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)(pVVar15 + -1))->Key).length_ = length
    ;
    local_40.length_ = 0;
    local_40.storage_ = (char *)0x0;
    operator_delete((void *)0x0);
    pVVar15->type_ = Undefined;
    (pVVar15->field_0).array_.storage_ = (Value<char> *)0x0;
    *(SizeT *)((long)&pVVar15->field_0 + 8) = 0;
    *(SizeT *)((long)&pVVar15->field_0 + 0xc) = 0;
  }
  else {
    pVVar15 = &pHVar5->Value;
  }
  return pVVar15;
}

Assistant:

Value_T &Get(const Char_T *key, const SizeT length) {
        if (Size() == Capacity()) {
            expand();
        }

        const SizeT hash = StringUtils::Hash(key, length);
        SizeT      *index;
        HItem      *item = find(index, key, length, hash);

        if (item != nullptr) {
            return item->Value;
        }

        item = insert(index, Key_T{key, length}, hash);
        Memory::Initialize(&(item->Value));

        return item->Value;
    }